

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall
FBehavior::StartTypedScripts
          (FBehavior *this,WORD type,AActor *activator,bool always,int arg1,bool runNow)

{
  int flags;
  ScriptPtr *code;
  DLevelScript *this_00;
  DLevelScript *runningScript;
  int i;
  ScriptPtr *ptr;
  int local_28;
  bool runNow_local;
  int arg1_local;
  bool always_local;
  AActor *activator_local;
  FBehavior *pFStack_10;
  WORD type_local;
  FBehavior *this_local;
  
  local_28 = arg1;
  runNow_local = always;
  _arg1_local = activator;
  activator_local._6_2_ = type;
  pFStack_10 = this;
  for (runningScript._4_4_ = 0; runningScript._4_4_ < this->NumScripts;
      runningScript._4_4_ = runningScript._4_4_ + 1) {
    code = this->Scripts + runningScript._4_4_;
    if (code->Type == activator_local._6_2_) {
      flags = 0;
      if ((runNow_local & 1U) != 0) {
        flags = 2;
      }
      this_00 = P_GetScriptGoing(_arg1_local,(line_t *)0x0,code->Number,code,this,&local_28,1,flags)
      ;
      if (runNow) {
        DLevelScript::RunScript(this_00);
      }
    }
  }
  return;
}

Assistant:

void FBehavior::StartTypedScripts (WORD type, AActor *activator, bool always, int arg1, bool runNow)
{
	const ScriptPtr *ptr;
	int i;

	for (i = 0; i < NumScripts; ++i)
	{
		ptr = &Scripts[i];
		if (ptr->Type == type)
		{
			DLevelScript *runningScript = P_GetScriptGoing (activator, NULL, ptr->Number,
				ptr, this, &arg1, 1, always ? ACS_ALWAYS : 0);
			if (runNow)
			{
				runningScript->RunScript ();
			}
		}
	}
}